

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
test<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
              *__return_storage_ptr__,string *inifile,Ini<wchar_t> *ini)

{
  wostream *pwVar1;
  wostringstream local_198 [8];
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  Ini<wchar_t> *ini_local;
  string *inifile_local;
  
  std::__cxx11::wostringstream::wostringstream(local_198);
  parse<wchar_t>(inifile,ini);
  pwVar1 = std::operator<<((wostream *)local_198,">>> ERRORS <<<");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  errors<wchar_t>((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,ini);
  pwVar1 = std::operator<<((wostream *)local_198,">>> GENERATE <<<");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  inipp::Ini<wchar_t>::generate(ini,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198)
  ;
  pwVar1 = std::operator<<((wostream *)local_198,">>> INTERPOLATE <<<");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  inipp::Ini<wchar_t>::interpolate(ini);
  inipp::Ini<wchar_t>::generate(ini,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198)
  ;
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static inline std::basic_string<CharT> test(const std::string & inifile, Ini<CharT> & ini) {
	std::basic_ostringstream<CharT> os;
	parse(inifile, ini);
	os << ">>> ERRORS <<<" << std::endl;
	errors(os, ini);
	os << ">>> GENERATE <<<" << std::endl;
	ini.generate(os);
	os << ">>> INTERPOLATE <<<" << std::endl;
	ini.interpolate();
	ini.generate(os);
	return os.str();
}